

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::vec_add_trunc_multipredict<dense_parameters>
               (multipredict_info<dense_parameters> *mp,float fx,uint64_t fi)

{
  float fVar1;
  long lVar2;
  size_t c;
  ulong uVar3;
  float fVar4;
  
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < mp->count; uVar3 = uVar3 + 1) {
    fVar1 = mp->weights->_begin[mp->weights->_weight_mask & fi];
    fVar4 = 0.0;
    if (mp->gravity < ABS(fVar1)) {
      fVar4 = mp->gravity * *(float *)(&DAT_00237a70 + (ulong)(fVar1 < 0.0) * 4) + fVar1;
    }
    *(float *)((long)mp->pred + lVar2) = fVar4 * fx + *(float *)((long)mp->pred + lVar2);
    fi = fi + mp->step;
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

inline void vec_add_trunc_multipredict(multipredict_info<T>& mp, const float fx, uint64_t fi)
{
  size_t index = fi;
  for (size_t c = 0; c < mp.count; c++, index += mp.step)
    mp.pred[c].scalar += fx * trunc_weight(mp.weights[index], mp.gravity);
}